

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int tree_5_3::threadTree(Btree t)

{
  code *pcVar1;
  Btree pre;
  Btree t_local;
  
  if (t != (Btree)0x0) {
    toThread(t,(Btree)0x0);
    uRam0000000000000000 = 0;
    t->rtag = 1;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int threadTree(Btree t) {
        Btree pre = nullptr;
        if (t != nullptr) {
            toThread(t, pre);
            pre->left = nullptr;
            t->rtag = 1;
        }
    }